

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVA.cpp
# Opt level: O3

void __thiscall
MT32Emu::TVA::reset(TVA *this,Part *newPart,PartialParam *newPartialParam,RhythmTemp *newRhythmTemp)

{
  byte bVar1;
  PartialParam *partialParam;
  Partial *partial;
  System *system;
  Bit8u BVar2;
  Bit8u expression;
  uint key;
  uint uVar3;
  int iVar4;
  int iVar5;
  Tables *tables;
  Poly *pPVar6;
  Synth *pSVar7;
  int iVar8;
  bool bVar9;
  
  this->part = newPart;
  this->partialParam = newPartialParam;
  this->rhythmTemp = newRhythmTemp;
  this->playing = true;
  tables = Tables::getInstance();
  pPVar6 = Partial::getPoly(this->partial);
  key = Poly::getKey(pPVar6);
  pPVar6 = Partial::getPoly(this->partial);
  uVar3 = Poly::getVelocity(pPVar6);
  partialParam = this->partialParam;
  BVar2 = (partialParam->tva).envTimeKeyfollow;
  iVar8 = (int)(key - 0x3c) >> (5 - BVar2 & 0x1f);
  if (BVar2 == '\0') {
    iVar8 = 0;
  }
  this->keyTimeSubtraction = iVar8;
  iVar4 = calcBiasAmpSubtraction((partialParam->tva).biasPoint1,(partialParam->tva).biasLevel1,key);
  iVar8 = 0xff;
  if (iVar4 < 0x100) {
    iVar5 = calcBiasAmpSubtraction
                      ((partialParam->tva).biasPoint2,(partialParam->tva).biasLevel2,key);
    iVar8 = iVar4 + iVar5;
    if (0xfe < iVar4 + iVar5) {
      iVar8 = 0xff;
    }
    if (0xff < iVar5) {
      iVar8 = 0xff;
    }
  }
  this->biasAmpSubtraction = iVar8;
  bVar1 = (partialParam->tva).veloSensitivity;
  iVar8 = -(bVar1 - 0x32);
  if (0x31 < bVar1) {
    iVar8 = bVar1 - 0x32;
  }
  this->veloAmpSubtraction = iVar8 - ((int)((uVar3 * 4 + -0x100) * (bVar1 - 0x32)) >> 8);
  partial = this->partial;
  system = this->system;
  BVar2 = Part::getVolume(this->part);
  iVar8 = this->biasAmpSubtraction;
  iVar4 = this->veloAmpSubtraction;
  expression = Part::getExpression(this->part);
  pSVar7 = Partial::getSynth(this->partial);
  iVar8 = calcBasicAmp(tables,partial,system,partialParam,BVar2,newRhythmTemp,iVar8,iVar4,expression
                       ,SUB41((*(ushort *)pSVar7->controlROMFeatures & 4) >> 2,0));
  BVar2 = (Bit8u)iVar8;
  bVar9 = (this->partialParam->tva).envTime[0] == '\0';
  if (bVar9) {
    BVar2 = BVar2 + (this->partialParam->tva).envLevel[0];
  }
  LA32Ramp::reset(this->ampRamp);
  this->target = BVar2;
  this->phase = (uint)bVar9;
  LA32Ramp::startRamp(this->ampRamp,BVar2,0xff);
  return;
}

Assistant:

void TVA::reset(const Part *newPart, const TimbreParam::PartialParam *newPartialParam, const MemParams::RhythmTemp *newRhythmTemp) {
	part = newPart;
	partialParam = newPartialParam;
	rhythmTemp = newRhythmTemp;

	playing = true;

	const Tables *tables = &Tables::getInstance();

	int key = partial->getPoly()->getKey();
	int velocity = partial->getPoly()->getVelocity();

	keyTimeSubtraction = calcKeyTimeSubtraction(partialParam->tva.envTimeKeyfollow, key);

	biasAmpSubtraction = calcBiasAmpSubtractions(partialParam, key);
	veloAmpSubtraction = calcVeloAmpSubtraction(partialParam->tva.veloSensitivity, velocity);

	int newTarget = calcBasicAmp(tables, partial, system, partialParam, part->getVolume(), newRhythmTemp, biasAmpSubtraction, veloAmpSubtraction, part->getExpression(), partial->getSynth()->controlROMFeatures->quirkRingModulationNoMix);
	int newPhase;
	if (partialParam->tva.envTime[0] == 0) {
		// Initially go to the TVA_PHASE_ATTACK target amp, and spend the next phase going from there to the TVA_PHASE_2 target amp
		// Note that this means that velocity never affects time for this partial.
		newTarget += partialParam->tva.envLevel[0];
		newPhase = TVA_PHASE_ATTACK; // The first target used in nextPhase() will be TVA_PHASE_2
	} else {
		// Initially go to the base amp determined by TVA level, part volume, etc., and spend the next phase going from there to the full TVA_PHASE_ATTACK target amp.
		newPhase = TVA_PHASE_BASIC; // The first target used in nextPhase() will be TVA_PHASE_ATTACK
	}

	ampRamp->reset();//currentAmp = 0;

	// "Go downward as quickly as possible".
	// Since the current value is 0, the LA32Ramp will notice that we're already at or below the target and trying to go downward,
	// and therefore jump to the target immediately and raise an interrupt.
	startRamp(Bit8u(newTarget), 0x80 | 127, newPhase);
}